

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O0

int32 __thiscall nuraft::raft_server::get_dc_id(raft_server *this,int32 srv_id)

{
  bool bVar1;
  element_type *this_00;
  undefined4 in_ESI;
  ptr<srv_config> s_conf;
  ptr<cluster_config> c_conf;
  raft_server *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  int32 local_4;
  
  get_config(in_stack_ffffffffffffffc8);
  std::__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x3339eb);
  cluster_config::get_server
            ((cluster_config *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe4)
  ;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&stack0xffffffffffffffc8);
  if (bVar1) {
    this_00 = std::__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x333a38);
    local_4 = srv_config::get_dc_id(this_00);
  }
  else {
    local_4 = -1;
  }
  std::shared_ptr<nuraft::srv_config>::~shared_ptr((shared_ptr<nuraft::srv_config> *)0x333a7c);
  std::shared_ptr<nuraft::cluster_config>::~shared_ptr
            ((shared_ptr<nuraft::cluster_config> *)0x333a86);
  return local_4;
}

Assistant:

int32 raft_server::get_dc_id(int32 srv_id) const {
    ptr<cluster_config> c_conf = get_config();
    ptr<srv_config> s_conf = c_conf->get_server(srv_id);
    if (!s_conf) return -1; // Not found.

    return s_conf->get_dc_id();
}